

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O2

int xmlShellLoad(xmlShellCtxtPtr ctxt,char *filename,xmlNodePtr node,xmlNodePtr node2)

{
  xmlDocPtr doc;
  xmlXPathContextPtr pxVar1;
  xmlChar *pxVar2;
  int iVar3;
  
  iVar3 = -1;
  if (filename != (char *)0x0 && ctxt != (xmlShellCtxtPtr)0x0) {
    if ((ctxt->doc == (xmlDocPtr)0x0) || (ctxt->doc->type != XML_HTML_DOCUMENT_NODE)) {
      doc = xmlReadFile(filename,(char *)0x0,0);
    }
    else {
      doc = htmlParseFile(filename,(char *)0x0);
    }
    if (doc != (xmlDocPtr)0x0) {
      if (ctxt->loaded == 1) {
        xmlFreeDoc(ctxt->doc);
      }
      ctxt->loaded = 1;
      xmlXPathFreeContext(ctxt->pctxt);
      (*xmlFree)(ctxt->filename);
      ctxt->doc = doc;
      ctxt->node = (xmlNodePtr)doc;
      pxVar1 = xmlXPathNewContext(doc);
      ctxt->pctxt = pxVar1;
      pxVar2 = xmlCanonicPath((xmlChar *)filename);
      ctxt->filename = (char *)pxVar2;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
xmlShellLoad(xmlShellCtxtPtr ctxt, char *filename,
             xmlNodePtr node ATTRIBUTE_UNUSED,
             xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlDocPtr doc;
    int html = 0;

    if ((ctxt == NULL) || (filename == NULL)) return(-1);
    if (ctxt->doc != NULL)
        html = (ctxt->doc->type == XML_HTML_DOCUMENT_NODE);

    if (html) {
#ifdef LIBXML_HTML_ENABLED
        doc = htmlParseFile(filename, NULL);
#else
        fprintf(ctxt->output, "HTML support not compiled in\n");
        doc = NULL;
#endif /* LIBXML_HTML_ENABLED */
    } else {
        doc = xmlReadFile(filename,NULL,0);
    }
    if (doc != NULL) {
        if (ctxt->loaded == 1) {
            xmlFreeDoc(ctxt->doc);
        }
        ctxt->loaded = 1;
#ifdef LIBXML_XPATH_ENABLED
        xmlXPathFreeContext(ctxt->pctxt);
#endif /* LIBXML_XPATH_ENABLED */
        xmlFree(ctxt->filename);
        ctxt->doc = doc;
        ctxt->node = (xmlNodePtr) doc;
#ifdef LIBXML_XPATH_ENABLED
        ctxt->pctxt = xmlXPathNewContext(doc);
#endif /* LIBXML_XPATH_ENABLED */
        ctxt->filename = (char *) xmlCanonicPath((xmlChar *) filename);
    } else
        return (-1);
    return (0);
}